

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageLoadStoreTests.cpp
# Opt level: O3

bool __thiscall
glcts::(anonymous_namespace)::BasicAllFormatsLoadFS::Read<tcu::Vector<float,4>>
          (BasicAllFormatsLoadFS *this,GLenum internalformat,Vector<float,_4> *value,
          Vector<float,_4> *expected_value,GLenum format,GLenum type)

{
  CallLogWrapper *this_00;
  _Alloc_hider _Var1;
  _Alloc_hider _Var2;
  BasicAllFormatsLoadFS *this_01;
  bool bVar3;
  GLuint program;
  ostream *poVar4;
  pointer pVVar5;
  void *__s;
  TestLog **this_02;
  undefined8 uVar6;
  GLenum e;
  GLenum e_00;
  Vector<float,_4> *extraout_RDX;
  Vector<float,_4> *extraout_RDX_00;
  Vector<float,_4> *v;
  Vector<float,_4> *v_00;
  uint uVar7;
  ulong uVar8;
  undefined4 in_register_0000008c;
  string local_298;
  string local_278;
  string local_258;
  GLuint texture;
  undefined8 local_230;
  char local_228;
  undefined7 uStack_227;
  GLuint m_buffer;
  undefined8 local_210;
  char local_208;
  undefined7 uStack_207;
  undefined8 local_1f8;
  BasicAllFormatsLoadFS *local_1f0;
  long *local_1e8;
  long local_1d8 [2];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  TestLog *local_1b8;
  undefined8 uStack_1b0;
  ShortByteData<tcu::Vector<float,_4>_> d;
  ios_base local_138 [264];
  
  local_1f8 = CONCAT44(in_register_0000008c,type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&d);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&d,"\n#define KSIZE 11\nlayout(",0x19);
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_258,(ShaderImageLoadStoreBase *)(ulong)internalformat,e);
  local_1f0 = this;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&d,local_258._M_dataplus._M_p,local_258._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,", binding = 1) readonly uniform ",0x20)
  ;
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  local_278._M_string_length = 0;
  local_278.field_2._M_local_buf[0] = '\0';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_278._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"image2D g_image;\nlayout(std430) buffer OutputBuffer {\n  ",0x38);
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_298._M_string_length = 0;
  local_298.field_2._M_local_buf[0] = '\0';
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_298._M_dataplus._M_p,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "vec4 data[KSIZE*KSIZE];\n};\nvoid main() {\n  ivec2 coord = ivec2(gl_FragCoord.xy);\n  "
             ,0x53);
  local_230 = 0;
  local_228 = '\0';
  _texture = &local_228;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_228,0);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,
             "vec4 v = imageLoad(g_image, coord);\n  data[coord.y * KSIZE + coord.x] = v;\n  //data[coord.y * KSIZE + coord.x] = "
             ,0x71);
  local_210 = 0;
  local_208 = '\0';
  _m_buffer = &local_208;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_208,0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"vec4",4);
  poVar4 = tcu::operator<<(poVar4,expected_value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,";\n  discard;\n}",0xe);
  if (_m_buffer != &local_208) {
    operator_delete(_m_buffer,CONCAT71(uStack_207,local_208) + 1);
  }
  if (_texture != &local_228) {
    operator_delete(_texture,CONCAT71(uStack_227,local_228) + 1);
  }
  this_01 = local_1f0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&d);
  std::ios_base::~ios_base(local_138);
  program = glcts::anon_unknown_0::ShaderImageLoadStoreBase::BuildProgram
                      ((ShaderImageLoadStoreBase *)this_01,
                       "\nlayout(location = 0) in vec4 i_position;\nvoid main() {\n  gl_Position = i_position;\n}"
                       ,(char *)local_1e8,false,false);
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8,local_1d8[0] + 1);
  }
  glcts::anon_unknown_0::ShortByteData<tcu::Vector<float,_4>_>::ShortByteData
            (&d,0xb,value,internalformat,format);
  this_00 = (CallLogWrapper *)(this_01 + 8);
  glu::CallLogWrapper::glGenTextures(this_00,1,&texture);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,texture);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri(this_00,0xde1,0x2800,0x2600);
  glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalformat,0xb,0xb);
  pVVar5 = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start;
  if ((int)internalformat < 0x8d88) {
    if (((internalformat == 0x8058) ||
        (pVVar5 = (pointer)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                           super__Vector_impl_data._M_start, internalformat == 0x8d76)) ||
       (pVVar5 = (pointer)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start, internalformat == 0x8d7c))
    goto LAB_00c43372;
  }
  else if (((internalformat == 0x8f97) || (internalformat == 0x8d8e)) ||
          (pVVar5 = (pointer)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                             super__Vector_impl_data._M_start, internalformat == 0x8d88))
  goto LAB_00c43372;
  pVVar5 = d.data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
LAB_00c43372:
  glu::CallLogWrapper::glTexSubImage2D(this_00,0xde1,0,0,0,0xb,0xb,format,(GLenum)local_1f8,pVVar5);
  glu::CallLogWrapper::glBindTexture(this_00,0xde1,0);
  glu::CallLogWrapper::glViewport(this_00,0,0,0xb,0xb);
  glu::CallLogWrapper::glClear(this_00,0x4000);
  glu::CallLogWrapper::glUseProgram(this_00,program);
  glu::CallLogWrapper::glBindImageTexture(this_00,1,texture,0,'\0',0,35000,internalformat);
  glu::CallLogWrapper::glBindVertexArray(this_00,*(GLuint *)(this_01 + 0x28));
  __s = operator_new(0x790);
  memset(__s,0,0x790);
  glu::CallLogWrapper::glGenBuffers(this_00,1,&m_buffer);
  glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,m_buffer);
  glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x790,__s,0x88e4);
  glu::CallLogWrapper::glDrawArrays(this_00,5,0,4);
  glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
  uVar7 = 0;
  uVar6 = 0x790;
  this_02 = (TestLog **)glu::CallLogWrapper::glMapBufferRange(this_00,0x90d2,0,0x790,1);
  bVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                    ((ShaderImageLoadStoreBase *)this_02,expected_value,
                     (vec4 *)(ulong)internalformat,(GLenum)uVar6);
  if (bVar3) {
    uVar8 = 0xffffffffffffffff;
    do {
      if (uVar8 == 0x77) {
        glu::CallLogWrapper::glUseProgram(this_00,0);
        glu::CallLogWrapper::glDeleteProgram(this_00,program);
        glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
        bVar3 = true;
        glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
        goto LAB_00c43644;
      }
      this_02 = this_02 + 2;
      bVar3 = glcts::anon_unknown_0::ShaderImageLoadStoreBase::Equal
                        ((ShaderImageLoadStoreBase *)this_02,expected_value,
                         (vec4 *)(ulong)internalformat,(GLenum)uVar6);
      uVar8 = uVar8 + 1;
    } while (bVar3);
    bVar3 = 0x77 < uVar8;
    uVar7 = (int)uVar8 + 1;
    v = extraout_RDX_00;
  }
  else {
    bVar3 = false;
    v = extraout_RDX;
  }
  local_1b8 = *this_02;
  uStack_1b0 = this_02[1];
  ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
            (&local_258,(ShaderImageLoadStoreBase *)&local_1b8,v);
  _Var2._M_p = local_258._M_dataplus._M_p;
  local_1c8 = *(undefined8 *)expected_value->m_data;
  uStack_1c0 = *(undefined8 *)(expected_value->m_data + 2);
  ShaderImageLoadStoreBase::ToString<tcu::Vector<float,4>>
            (&local_278,(ShaderImageLoadStoreBase *)&local_1c8,v_00);
  _Var1._M_p = local_278._M_dataplus._M_p;
  ShaderImageLoadStoreBase::FormatEnumToString_abi_cxx11_
            (&local_298,(ShaderImageLoadStoreBase *)(ulong)internalformat,e_00);
  glcts::anon_unknown_0::Output
            ("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n",(ulong)uVar7,
             _Var2._M_p,_Var1._M_p,local_298._M_dataplus._M_p,1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,
                    CONCAT71(local_298.field_2._M_allocated_capacity._1_7_,
                             local_298.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
  glu::CallLogWrapper::glDeleteTextures(this_00,1,&texture);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,&m_buffer);
LAB_00c43644:
  operator_delete(__s,0x790);
  if (d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)d.datab.super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  if (d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)d.datas.super__Vector_base<short,_std::allocator<short>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (d.data.super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(d.data.
                    super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)d.data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)d.data.
                          super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar3;
}

Assistant:

bool Read(GLenum internalformat, const T& value, const T& expected_value, GLenum format, GLenum type)
	{
		const char* src_vs =
			NL "layout(location = 0) in vec4 i_position;" NL "void main() {" NL "  gl_Position = i_position;" NL "}";
		GLuint			 program = BuildProgram(src_vs, GenFS(internalformat, expected_value).c_str());
		const int		 kSize   = 11;
		ShortByteData<T> d(kSize, value, internalformat, format);
		GLuint			 texture;
		glGenTextures(1, &texture);
		GLuint unit = 1;
		glBindTexture(GL_TEXTURE_2D, texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalformat, kSize, kSize);
		if (Shorts(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datas[0]);
		else if (Bytes(internalformat))
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.datab[0]);
		else
			glTexSubImage2D(GL_TEXTURE_2D, 0, 0, 0, kSize, kSize, format, type, &d.data[0]);
		glBindTexture(GL_TEXTURE_2D, 0);

		glViewport(0, 0, kSize, kSize);
		glClear(GL_COLOR_BUFFER_BIT);
		glUseProgram(program);
		glBindImageTexture(unit, texture, 0, GL_FALSE, 0, GL_READ_ONLY, internalformat);
		glBindVertexArray(m_vao);

		std::vector<T> out_data(kSize * kSize);
		GLuint		   m_buffer;
		glGenBuffers(1, &m_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, kSize * kSize * 4 * 4, &out_data[0], GL_STATIC_DRAW);

		glDrawArrays(GL_TRIANGLE_STRIP, 0, 4);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		T* map_data = (T*)glMapBufferRange(GL_SHADER_STORAGE_BUFFER, 0, kSize * kSize * 4 * 4, GL_MAP_READ_BIT);
		for (int i = 0; i < kSize * kSize; ++i)
		{
			if (!Equal(map_data[i], expected_value, internalformat))
			{
				Output("[%d] Value is: %s. Value should be: %s. Format is: %s. Unit is: %d.\n", i,
					   ToString(map_data[i]).c_str(), ToString(expected_value).c_str(),
					   FormatEnumToString(internalformat).c_str(), unit);
				glUseProgram(0);
				glDeleteProgram(program);
				glDeleteTextures(1, &texture);
				glDeleteBuffers(1, &m_buffer);
				return false;
			}
		}
		glUseProgram(0);
		glDeleteProgram(program);
		glDeleteTextures(1, &texture);
		glDeleteBuffers(1, &m_buffer);
		return true;
	}